

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmSignature.cpp
# Opt level: O0

void __thiscall
Wasm::WasmSignature::AllocateResults(WasmSignature *this,uint32 count,Recycler *recycler)

{
  uint32 uVar1;
  WasmCompilationException *this_00;
  Recycler *pRVar2;
  WasmType *ptr;
  TrackAllocData local_58;
  Recycler *local_20;
  Recycler *recycler_local;
  WasmSignature *pWStack_10;
  uint32 count_local;
  WasmSignature *this_local;
  
  local_20 = recycler;
  recycler_local._4_4_ = count;
  pWStack_10 = this;
  uVar1 = GetResultCount(this);
  pRVar2 = local_20;
  if (uVar1 != 0) {
    this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_00,
               L"Invalid call to WasmSignature::AllocateResults: Results are already allocated");
    __cxa_throw(this_00,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  if (recycler_local._4_4_ != 0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_58,(type_info *)&WasmTypes::WasmType::typeinfo,0,(ulong)recycler_local._4_4_,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmSignature.cpp"
               ,0x35);
    pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_58);
    ptr = Memory::AllocateArray<Memory::Recycler,Wasm::WasmTypes::WasmType,false>
                    ((Memory *)pRVar2,(Recycler *)Memory::Recycler::AllocLeafZero,0,
                     (ulong)recycler_local._4_4_);
    Memory::WriteBarrierPtr<Wasm::WasmTypes::WasmType>::operator=(&this->m_results,ptr);
  }
  this->m_resultsCount = recycler_local._4_4_;
  return;
}

Assistant:

void WasmSignature::AllocateResults(uint32 count, Recycler * recycler)
{
    if (GetResultCount() != 0)
    {
        throw WasmCompilationException(_u("Invalid call to WasmSignature::AllocateResults: Results are already allocated"));
    }
    if (count > 0)
    {
        m_results = RecyclerNewArrayLeafZ(recycler, WasmTypes::WasmType, count);
    }
    m_resultsCount = count;
}